

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_sort_key.cpp
# Opt level: O3

void duckdb::ConstructSortKeyRecursive
               (SortKeyVectorData *vector_data,SortKeyChunk chunk,SortKeyConstructInfo *info)

{
  PhysicalType PVar1;
  NotImplementedException *this;
  undefined1 in_stack_00000038 [32];
  string local_58;
  LogicalType local_38;
  
  PVar1 = (vector_data->vec->type).physical_type_;
  if (PVar1 < VARCHAR) {
    switch(PVar1) {
    case BOOL:
      TemplatedConstructSortKey<duckdb::SortKeyConstantOperator<bool>>
                (vector_data,(SortKeyChunk)in_stack_00000038,info);
      return;
    case UINT8:
      TemplatedConstructSortKey<duckdb::SortKeyConstantOperator<unsigned_char>>
                (vector_data,(SortKeyChunk)in_stack_00000038,info);
      return;
    case INT8:
      TemplatedConstructSortKey<duckdb::SortKeyConstantOperator<signed_char>>
                (vector_data,(SortKeyChunk)in_stack_00000038,info);
      return;
    case UINT16:
      TemplatedConstructSortKey<duckdb::SortKeyConstantOperator<unsigned_short>>
                (vector_data,(SortKeyChunk)in_stack_00000038,info);
      return;
    case INT16:
      TemplatedConstructSortKey<duckdb::SortKeyConstantOperator<short>>
                (vector_data,(SortKeyChunk)in_stack_00000038,info);
      return;
    case UINT32:
      TemplatedConstructSortKey<duckdb::SortKeyConstantOperator<unsigned_int>>
                (vector_data,(SortKeyChunk)in_stack_00000038,info);
      return;
    case INT32:
      TemplatedConstructSortKey<duckdb::SortKeyConstantOperator<int>>
                (vector_data,(SortKeyChunk)in_stack_00000038,info);
      return;
    case UINT64:
      TemplatedConstructSortKey<duckdb::SortKeyConstantOperator<unsigned_long>>
                (vector_data,(SortKeyChunk)in_stack_00000038,info);
      return;
    case INT64:
      TemplatedConstructSortKey<duckdb::SortKeyConstantOperator<long>>
                (vector_data,(SortKeyChunk)in_stack_00000038,info);
      return;
    case FLOAT:
      TemplatedConstructSortKey<duckdb::SortKeyConstantOperator<float>>(vector_data,chunk,info);
      return;
    case DOUBLE:
      TemplatedConstructSortKey<duckdb::SortKeyConstantOperator<double>>(vector_data,chunk,info);
      return;
    case INTERVAL:
      TemplatedConstructSortKey<duckdb::SortKeyConstantOperator<duckdb::interval_t>>
                (vector_data,(SortKeyChunk)in_stack_00000038,info);
      return;
    case LIST:
      ConstructSortKeyList<duckdb::SortKeyListEntry>(vector_data,chunk,info);
      return;
    case STRUCT:
      ConstructSortKeyStruct(vector_data,chunk,info);
      return;
    case ARRAY:
      ConstructSortKeyList<duckdb::SortKeyArrayEntry>(vector_data,chunk,info);
      return;
    }
  }
  else {
    if (PVar1 == VARCHAR) {
      if ((vector_data->vec->type).id_ == VARCHAR) {
        TemplatedConstructSortKey<duckdb::SortKeyVarcharOperator>
                  (vector_data,(SortKeyChunk)in_stack_00000038,info);
        return;
      }
      TemplatedConstructSortKey<duckdb::SortKeyBlobOperator>(vector_data,chunk,info);
      return;
    }
    if (PVar1 == UINT128) {
      TemplatedConstructSortKey<duckdb::SortKeyConstantOperator<duckdb::uhugeint_t>>
                (vector_data,(SortKeyChunk)in_stack_00000038,info);
      return;
    }
    if (PVar1 == INT128) {
      TemplatedConstructSortKey<duckdb::SortKeyConstantOperator<duckdb::hugeint_t>>
                (vector_data,(SortKeyChunk)in_stack_00000038,info);
      return;
    }
  }
  this = (NotImplementedException *)__cxa_allocate_exception(0x10);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"Unsupported type %s in ConstructSortKey","");
  LogicalType::LogicalType(&local_38,&vector_data->vec->type);
  NotImplementedException::NotImplementedException<duckdb::LogicalType>(this,&local_58,&local_38);
  __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static void ConstructSortKeyRecursive(SortKeyVectorData &vector_data, SortKeyChunk chunk, SortKeyConstructInfo &info) {
	switch (vector_data.GetPhysicalType()) {
	case PhysicalType::BOOL:
		TemplatedConstructSortKey<SortKeyConstantOperator<bool>>(vector_data, chunk, info);
		break;
	case PhysicalType::UINT8:
		TemplatedConstructSortKey<SortKeyConstantOperator<uint8_t>>(vector_data, chunk, info);
		break;
	case PhysicalType::INT8:
		TemplatedConstructSortKey<SortKeyConstantOperator<int8_t>>(vector_data, chunk, info);
		break;
	case PhysicalType::UINT16:
		TemplatedConstructSortKey<SortKeyConstantOperator<uint16_t>>(vector_data, chunk, info);
		break;
	case PhysicalType::INT16:
		TemplatedConstructSortKey<SortKeyConstantOperator<int16_t>>(vector_data, chunk, info);
		break;
	case PhysicalType::UINT32:
		TemplatedConstructSortKey<SortKeyConstantOperator<uint32_t>>(vector_data, chunk, info);
		break;
	case PhysicalType::INT32:
		TemplatedConstructSortKey<SortKeyConstantOperator<int32_t>>(vector_data, chunk, info);
		break;
	case PhysicalType::UINT64:
		TemplatedConstructSortKey<SortKeyConstantOperator<uint64_t>>(vector_data, chunk, info);
		break;
	case PhysicalType::INT64:
		TemplatedConstructSortKey<SortKeyConstantOperator<int64_t>>(vector_data, chunk, info);
		break;
	case PhysicalType::FLOAT:
		TemplatedConstructSortKey<SortKeyConstantOperator<float>>(vector_data, chunk, info);
		break;
	case PhysicalType::DOUBLE:
		TemplatedConstructSortKey<SortKeyConstantOperator<double>>(vector_data, chunk, info);
		break;
	case PhysicalType::INTERVAL:
		TemplatedConstructSortKey<SortKeyConstantOperator<interval_t>>(vector_data, chunk, info);
		break;
	case PhysicalType::UINT128:
		TemplatedConstructSortKey<SortKeyConstantOperator<uhugeint_t>>(vector_data, chunk, info);
		break;
	case PhysicalType::INT128:
		TemplatedConstructSortKey<SortKeyConstantOperator<hugeint_t>>(vector_data, chunk, info);
		break;
	case PhysicalType::VARCHAR:
		if (vector_data.vec.GetType().id() == LogicalTypeId::VARCHAR) {
			TemplatedConstructSortKey<SortKeyVarcharOperator>(vector_data, chunk, info);
		} else {
			TemplatedConstructSortKey<SortKeyBlobOperator>(vector_data, chunk, info);
		}
		break;
	case PhysicalType::STRUCT:
		ConstructSortKeyStruct(vector_data, chunk, info);
		break;
	case PhysicalType::LIST:
		ConstructSortKeyList<SortKeyListEntry>(vector_data, chunk, info);
		break;
	case PhysicalType::ARRAY:
		ConstructSortKeyList<SortKeyArrayEntry>(vector_data, chunk, info);
		break;
	default:
		throw NotImplementedException("Unsupported type %s in ConstructSortKey", vector_data.vec.GetType());
	}
}